

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::GrowthInfo::OverwriteControlAsFull
          (GrowthInfo *this,ctrl_t ctrl)

{
  if ((this->growth_left_info_ & 0x7fffffffffffffff) != 0 || ctrl != kEmpty) {
    this->growth_left_info_ = this->growth_left_info_;
    return;
  }
  __assert_fail("(GetGrowthLeft() >= static_cast<size_t>(IsEmpty(ctrl))) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x472,"void absl::container_internal::GrowthInfo::OverwriteControlAsFull(ctrl_t)");
}

Assistant:

size_t GetGrowthLeft() const { return growth_left_info_ & kGrowthLeftMask; }